

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.hpp
# Opt level: O1

string * __thiscall de::toString<char_const*>(string *__return_storage_ptr__,de *this,char **value)

{
  char *__s;
  size_t sVar1;
  ostringstream s;
  long local_188 [14];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  __s = *(char **)this;
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_188 + (int)*(undefined8 *)(local_188[0] + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,__s,sVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString (const T& value)
{
	std::ostringstream s;
	s << value;
	return s.str();
}